

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

Transliterator * __thiscall
icu_63::Transliterator::getElement(Transliterator *this,int32_t index,UErrorCode *ec)

{
  UBool UVar1;
  Transliterator *local_58;
  int local_4c;
  long *local_48;
  int32_t n;
  CompoundTransliterator *cpd;
  UErrorCode *ec_local;
  int32_t index_local;
  Transliterator *this_local;
  
  UVar1 = ::U_FAILURE(*ec);
  this_local = this;
  if (UVar1 == '\0') {
    if (this == (Transliterator *)0x0) {
      local_48 = (long *)0x0;
    }
    else {
      local_48 = (long *)__dynamic_cast(this,&typeinfo,&CompoundTransliterator::typeinfo,0);
    }
    if (local_48 == (long *)0x0) {
      local_4c = 1;
    }
    else {
      local_4c = (**(code **)(*local_48 + 0x88))();
    }
    if ((index < 0) || (local_4c <= index)) {
      *ec = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      local_58 = this;
      if (local_4c != 1) {
        local_58 = (Transliterator *)(**(code **)(*local_48 + 0x90))(local_48,index);
      }
      this_local = local_58;
    }
  }
  return this_local;
}

Assistant:

const Transliterator& Transliterator::getElement(int32_t index, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return *this;
    }
    const CompoundTransliterator* cpd = dynamic_cast<const CompoundTransliterator*>(this);
    int32_t n = (cpd == NULL) ? 1 : cpd->getCount();
    if (index < 0 || index >= n) {
        ec = U_INDEX_OUTOFBOUNDS_ERROR;
        return *this;
    } else {
        return (n == 1) ? *this : cpd->getTransliterator(index);
    }
}